

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PushItemWidth(float item_width)

{
  int *piVar1;
  ImVector<float> *pIVar2;
  int iVar3;
  ImGuiWindow *pIVar4;
  float *pfVar5;
  ImGuiContext *pIVar6;
  float *__dest;
  int iVar7;
  int iVar8;
  ImGuiContext *ctx;
  
  pIVar6 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  iVar8 = (pIVar4->DC).ItemWidthStack.Size;
  iVar3 = (pIVar4->DC).ItemWidthStack.Capacity;
  if (iVar8 == iVar3) {
    iVar8 = iVar8 + 1;
    if (iVar3 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar3 / 2 + iVar3;
    }
    if (iVar8 < iVar7) {
      iVar8 = iVar7;
    }
    if (iVar3 < iVar8) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (float *)(*GImAllocatorAllocFunc)((long)iVar8 << 2,GImAllocatorUserData);
      pfVar5 = (pIVar4->DC).ItemWidthStack.Data;
      if (pfVar5 != (float *)0x0) {
        memcpy(__dest,pfVar5,(long)(pIVar4->DC).ItemWidthStack.Size << 2);
        pfVar5 = (pIVar4->DC).ItemWidthStack.Data;
        if ((pfVar5 != (float *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pfVar5,GImAllocatorUserData);
      }
      (pIVar4->DC).ItemWidthStack.Data = __dest;
      (pIVar4->DC).ItemWidthStack.Capacity = iVar8;
    }
  }
  (pIVar4->DC).ItemWidthStack.Data[(pIVar4->DC).ItemWidthStack.Size] = (pIVar4->DC).ItemWidth;
  pIVar2 = &(pIVar4->DC).ItemWidthStack;
  pIVar2->Size = pIVar2->Size + 1;
  if ((item_width == 0.0) && (!NAN(item_width))) {
    item_width = pIVar4->ItemWidthDefault;
  }
  (pIVar4->DC).ItemWidth = item_width;
  *(byte *)&(pIVar6->NextItemData).Flags = (byte)(pIVar6->NextItemData).Flags & 0xfe;
  return;
}

Assistant:

void ImGui::PushItemWidth(float item_width)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    window->DC.ItemWidthStack.push_back(window->DC.ItemWidth); // Backup current width
    window->DC.ItemWidth = (item_width == 0.0f ? window->ItemWidthDefault : item_width);
    g.NextItemData.Flags &= ~ImGuiNextItemDataFlags_HasWidth;
}